

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LRUMap.hh
# Opt level: O0

void __thiscall
phosg::
LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::unlink_item(LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,Item *i)

{
  Item *i_local;
  LRUMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  if (this->head == i) {
    this->head = i->next;
  }
  if (this->tail == i) {
    this->tail = i->prev;
  }
  if (i->prev != (Item *)0x0) {
    i->prev->next = i->next;
  }
  if (i->next != (Item *)0x0) {
    i->next->prev = i->prev;
  }
  i->prev = (Item *)0x0;
  i->next = (Item *)0x0;
  return;
}

Assistant:

void unlink_item(Item* i) const {
    if (this->head == i) {
      this->head = i->next;
    }
    if (this->tail == i) {
      this->tail = i->prev;
    }
    if (i->prev) {
      i->prev->next = i->next;
    }
    if (i->next) {
      i->next->prev = i->prev;
    }
    i->prev = nullptr;
    i->next = nullptr;
  }